

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

void SubtractionHelper<char,long_long,18>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *lhs,longlong *rhs,longlong *result)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)*lhs;
  lVar1 = *rhs;
  lVar3 = lVar4 - lVar1;
  if (SBORROW8(lVar4,lVar1)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if (((lVar4 <= lVar3 || -1 < lVar1) || *lhs < '\0') && (lVar3 <= lVar4 || lVar1 < 1)) {
    *result = lVar3;
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is any signed int32 or smaller, rhs is int64
        std::int64_t tmp = (std::int64_t)lhs - rhs;

        if( ( lhs >= 0 && rhs < 0 && tmp < lhs ) ||
            ( rhs > 0 && tmp > lhs ) )
        {
            E::SafeIntOnOverflow();
            //else OK
        }

        result = (T)tmp;
    }